

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int rcholu(double *A,int N,int stride,double *U22)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  double *pdVar8;
  uint m;
  double dVar9;
  
  lVar2 = (long)stride;
  iVar7 = N + -1;
  pdVar8 = A + lVar2 + 1;
  while( true ) {
    dVar9 = *A;
    if (N == 1) {
      iVar7 = -1;
      if (0.0 < dVar9) {
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        *A = dVar9;
        iVar7 = 0;
      }
      return iVar7;
    }
    if (dVar9 < 0.0) break;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    *A = dVar9;
    if (1 < N) {
      uVar3 = 1;
      do {
        A[uVar3] = A[uVar3] / dVar9;
        uVar3 = uVar3 + 1;
      } while ((uint)N != uVar3);
    }
    m = N - 1;
    mmult(A + 1,A + 1,U22,m,1,m);
    if (1 < N) {
      uVar3 = 0;
      pdVar4 = pdVar8;
      pdVar5 = U22;
      do {
        lVar6 = 0;
        do {
          pdVar4[lVar6] = pdVar4[lVar6] - pdVar5[lVar6];
          lVar1 = uVar3 + lVar6;
          lVar6 = lVar6 + 1;
        } while (lVar1 + 1 < (long)(int)m);
        uVar3 = uVar3 + 1;
        pdVar5 = pdVar5 + (long)iVar7 + 1;
        pdVar4 = pdVar4 + lVar2 + 1;
      } while (uVar3 != m);
    }
    A = A + lVar2 + 1;
    iVar7 = iVar7 + -1;
    pdVar8 = pdVar8 + lVar2 + 1;
    N = m;
  }
  return -1;
}

Assistant:

static int rcholu(double *A,int N, int stride, double *U22) {
	int sc;
	int j,i,u,w;
	double u11;
	
	if (N == 1) {
		if (A[0] > 0) {
			A[0] = sqrt(A[0]);
			return 0;
		} else {
			return -1;
		}
	} else {
		if (A[0] < 0) {
			return -1;
		}
		u11 = sqrt(A[0]);
		A[0] = u11;
		for (j = 1; j < N;++j) {
			A[j] /= u11;
		}
		mmult(A+1,A+1,U22,N-1,1,N-1);
		for (i = 0; i < N-1; ++i) {
			u = stride + 1+ i * stride;
			w = i * (N-1);
			for(j = i; j < N-1;j++) {
				A[j + u] -= U22[j + w];
			}
		}
		
		sc = rcholu(A+stride+1,N-1,stride,U22);
		if (sc == -1) {
			return -1;
		}
		
	}
	
	return sc;
	
}